

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

rf_mipmaps_image *
rf_load_ktx_image_to_buffer
          (rf_mipmaps_image *__return_storage_ptr__,void *src,rf_int src_size,void *dst,
          rf_int dst_size)

{
  rf_pixel_format rVar1;
  ulong uVar2;
  _Bool _Var3;
  size_t __n;
  int *piVar4;
  long lVar5;
  rf_ktx_header header;
  
  *(undefined8 *)((long)&__return_storage_ptr__->field_0 + 0x10) = 0;
  *(undefined8 *)&__return_storage_ptr__->mipmaps = 0;
  (__return_storage_ptr__->field_0).image.data = (void *)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->field_0 + 8) = 0;
  if (0x40 < (ulong)src_size && src != (void *)0x0) {
    header.id._0_8_ = *src;
    header._8_8_ = *(undefined8 *)((long)src + 8);
    header._16_8_ = *(undefined8 *)((long)src + 0x10);
    header._24_8_ = *(undefined8 *)((long)src + 0x18);
    header._48_8_ = *(undefined8 *)((long)src + 0x30);
    header._56_8_ = *(ulong *)((long)src + 0x38);
    header.gl_base_internal_format = (uint)*(undefined8 *)((long)src + 0x20);
    header.width = (uint)((ulong)*(undefined8 *)((long)src + 0x20) >> 0x20);
    header.height = (uint)*(undefined8 *)((long)src + 0x28);
    header.depth = (uint)((ulong)*(undefined8 *)((long)src + 0x28) >> 0x20);
    uVar2 = (ulong)header._56_8_ >> 0x20;
    _Var3 = rf_match_str_cstr(header.id + 1,6,"KTX 11");
    if (_Var3) {
      lVar5 = src_size - uVar2;
      *(ulong *)((long)&__return_storage_ptr__->field_0 + 8) = CONCAT44(header.height,header.width);
      __return_storage_ptr__->mipmaps = header.mipmap_levels;
      if (4 < lVar5 - 0x40U) {
        piVar4 = (int *)(uVar2 + 0x40 + (long)src);
        __n = (size_t)*piVar4;
        if ((long)__n <= dst_size && lVar5 + -0x44 <= (long)__n) {
          memcpy(dst,piVar4 + 1,__n);
          (__return_storage_ptr__->field_0).image.data = dst;
          if (header.gl_internal_format == 0x8d64) {
            rVar1 = RF_COMPRESSED_ETC1_RGB;
          }
          else if (header.gl_internal_format == 0x9278) {
            rVar1 = RF_COMPRESSED_ETC2_EAC_RGBA;
          }
          else {
            if (header.gl_internal_format != 0x9274) {
              return __return_storage_ptr__;
            }
            rVar1 = RF_COMPRESSED_ETC2_RGB;
          }
          (__return_storage_ptr__->field_0).image.format = rVar1;
          (__return_storage_ptr__->field_0).image.valid = true;
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_mipmaps_image rf_load_ktx_image_to_buffer(const void* src, rf_int src_size, void* dst, rf_int dst_size)
{
    rf_mipmaps_image result = {0};

    if (src && src_size > sizeof(rf_ktx_header))
    {
        rf_ktx_header header = *(rf_ktx_header*)src;
        src = (char*)src + sizeof(rf_ktx_header) + header.key_value_data_size;
        src_size -= sizeof(rf_ktx_header) + header.key_value_data_size;

        if (rf_match_str_cstr(header.id + 1, 6, "KTX 11"))
        {
            result.width = header.width;
            result.height = header.height;
            result.mipmaps = header.mipmap_levels;

            int image_size = 0;
            if (src_size > sizeof(unsigned int))
            {
                memcpy(&image_size, src, sizeof(unsigned int));
                src = (char*)src + sizeof(unsigned int);
                src_size -= sizeof(unsigned int);

                if (image_size >= src_size && dst_size >= image_size)
                {
                    memcpy(dst, src, image_size);
                    result.data = dst;

                    switch (header.gl_internal_format)
                    {
                        case 0x8D64: result.format = RF_COMPRESSED_ETC1_RGB; break;
                        case 0x9274: result.format = RF_COMPRESSED_ETC2_RGB; break;
                        case 0x9278: result.format = RF_COMPRESSED_ETC2_EAC_RGBA; break;
                        default: return result;
                    }

                    result.valid = true;
                }
            }
        }
    }

    return result;
}